

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
vkt::shaderexecutor::TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward>::
createCase(MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
          TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward> *this,
          CaseContext *ctx)

{
  TestContext *testCtx;
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  char *name;
  char *description;
  FaceForward<1> *func;
  PrecisionCase *pPVar3;
  FaceForward<2> *func_00;
  FaceForward<3> *func_01;
  FaceForward<4> *func_02;
  DefaultDeleter<tcu::TestNode> local_d2;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  TestNode *local_28;
  TestCaseGroup *group;
  CaseContext *ctx_local;
  TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward> *this_local;
  
  group = (TestCaseGroup *)ctx;
  ctx_local = (CaseContext *)this;
  this_local = (TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward> *)
               __return_storage_ptr__;
  pTVar2 = (TestNode *)operator_new(0x70);
  testCtx = (TestContext *)(group->super_TestNode).m_name.field_2._M_allocated_capacity;
  name = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,name,description);
  pTVar1 = group;
  local_28 = pTVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"scalar",&local_59);
  func = instance<vkt::shaderexecutor::Functions::FaceForward<1>>();
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<float,float,float,float,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_58,
                      (Func<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>_>
                       *)func);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pTVar1 = group;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"vec2",&local_81);
  func_00 = instance<vkt::shaderexecutor::Functions::FaceForward<2>>();
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_80,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
                       *)func_00);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pTVar1 = group;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"vec3",&local_a9);
  func_01 = instance<vkt::shaderexecutor::Functions::FaceForward<3>>();
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_a8,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void>_>
                       *)func_01);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pTVar1 = group;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"vec4",&local_d1);
  func_02 = instance<vkt::shaderexecutor::Functions::FaceForward<4>>();
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_d0,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
                       *)func_02);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pTVar2 = local_28;
  de::DefaultDeleter<tcu::TestNode>::DefaultDeleter(&local_d2);
  de::details::MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::MovePtr
            (__return_storage_ptr__,pTVar2);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase		(const CaseContext& ctx) const
	{
		TestCaseGroup*	group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		group->addChild(createFuncCase(ctx, "scalar", instance<GenF<1> >()));
		group->addChild(createFuncCase(ctx, "vec2", instance<GenF<2> >()));
		group->addChild(createFuncCase(ctx, "vec3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "vec4", instance<GenF<4> >()));

		return MovePtr<TestNode>(group);
	}